

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O0

void __thiscall
CountOverJoin::valueCount(CountOverJoin *this,Union *factorisationNode,DTreeNode *dTreeNode)

{
  Union *in_RDX;
  CountOverJoin *in_RSI;
  long in_RDI;
  int i;
  DTreeNode *child;
  unsigned_long val;
  int numOfChildren;
  int local_34;
  ulong local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  if ((in_RDX[2].cacheIndex & 1) != 0) {
    if (*(int *)(*(long *)(in_RDI + 0x60) + (ulong)*(ushort *)&(in_RSI->_pathToFiles).field_2 * 4)
        != 0) {
      return;
    }
    *(undefined4 *)
     (*(long *)(in_RDI + 0x60) + (ulong)*(ushort *)&(in_RSI->_pathToFiles).field_2 * 4) = 1;
  }
  *(size_type *)(in_RDI + 0x68) = (in_RSI->_pathToFiles)._M_string_length + *(long *)(in_RDI + 0x68)
  ;
  iVar1 = *(int *)&in_RDX->sumIndexes;
  for (local_28 = 0; local_28 < (in_RSI->_pathToFiles)._M_string_length; local_28 = local_28 + 1) {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      valueCount(in_RSI,in_RDX,(DTreeNode *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void CountOverJoin::valueCount(node::Union* factorisationNode, DTreeNode* dTreeNode)
{
    if (dTreeNode->_caching)
    {
        if (cachedCounts[factorisationNode->cacheIndex] > 0)
            return;

        cachedCounts[factorisationNode->cacheIndex] = 1;
    }

    numberOfValues += factorisationNode->numberOfValues;

    int numOfChildren = dTreeNode -> _numOfChildren;
    for (unsigned long val = 0; val < factorisationNode->numberOfValues; ++val)
    {
        DTreeNode* child = dTreeNode->_firstChild; 
        for (int i = 0; i < numOfChildren; ++i)
        {
            valueCount(factorisationNode->children[val * numOfChildren + i], child);
            child = child->_next;
        }
    }
}